

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O0

Gia_Man_t * Gia_ManCofTest(Gia_Man_t *pGia,int nFrameMax,int nConfMax,int nTimeMax,int fVerbose)

{
  bool bVar1;
  int iVar2;
  abctime aVar3;
  long Limit;
  Ccf_Man_t *p_00;
  Gia_Man_t *pGVar4;
  abctime aVar5;
  Gia_Man_t *pGVar6;
  bool bVar7;
  abctime clk;
  abctime nTimeToStop;
  int local_48;
  int fFailed;
  int RetValue;
  int Lit;
  int i;
  int f;
  Gia_Obj_t *pObj;
  Ccf_Man_t *p;
  Gia_Man_t *pNew;
  int fVerbose_local;
  int nTimeMax_local;
  int nConfMax_local;
  int nFrameMax_local;
  Gia_Man_t *pGia_local;
  
  local_48 = -1;
  bVar1 = false;
  aVar3 = Abc_Clock();
  Limit = aVar3 + (long)nTimeMax * 1000000;
  aVar3 = Abc_Clock();
  iVar2 = Gia_ManPoNum(pGia);
  if (iVar2 != 1) {
    __assert_fail("Gia_ManPoNum(pGia) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCCof.c"
                  ,0x112,"Gia_Man_t *Gia_ManCofTest(Gia_Man_t *, int, int, int, int)");
  }
  p_00 = Ccf_ManStart(pGia,nFrameMax,nConfMax,nTimeMax,fVerbose);
  if (nTimeMax != 0) {
    sat_solver_set_runtime_limit(p_00->pSat,Limit);
  }
  for (Lit = 0; Lit < nFrameMax; Lit = Lit + 1) {
    if (fVerbose != 0) {
      printf("ITER %3d :\n",(ulong)(uint)Lit);
    }
    pGVar4 = (Gia_Man_t *)Gia_ManUnrollAdd(p_00->pUnr,Lit + 1);
    p_00->pFrames = pGVar4;
    Gia_ManCofExtendSolver(p_00);
    iVar2 = Gia_ManUnrollLastLit(p_00->pUnr);
    local_48 = Gia_ManCofGetReachable(p_00,iVar2);
    if (local_48 != 0) break;
    Gia_ManSetPhase(p_00->pFrames);
    RetValue = 0;
    while( true ) {
      iVar2 = Gia_ManPoNum(p_00->pFrames);
      bVar7 = false;
      if (RetValue < iVar2) {
        _i = Gia_ManCo(p_00->pFrames,RetValue);
        bVar7 = _i != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) goto LAB_0090ccd5;
      if (*(long *)_i < 0) break;
      RetValue = RetValue + 1;
    }
    printf("Property failed in frame %d.\n",(ulong)(uint)Lit);
    bVar1 = true;
LAB_0090ccd5:
    iVar2 = Gia_ManPoNum(p_00->pFrames);
    if (RetValue < iVar2) break;
  }
  if ((Limit == 0) || (aVar5 = Abc_Clock(), aVar5 <= Limit)) {
    if (Lit == nFrameMax) {
      printf("Completed %d frames without converging.  ",(ulong)(uint)Lit);
    }
    else if (local_48 == 1) {
      printf("Backward reachability converged after %d iterations.  ",(ulong)(Lit - 1));
    }
    else if (local_48 == -1) {
      printf("Conflict limit or timeout is reached after %d frames.  ",(ulong)(Lit - 1));
    }
  }
  else {
    printf("Runtime limit (%d sec) is reached after %d frames.  ",(ulong)(uint)nTimeMax,
           (ulong)(uint)Lit);
  }
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Runtime",aVar5 - aVar3);
  if ((bVar1) || (local_48 != 1)) {
    if (!bVar1) {
      printf("Property is undecided.\n");
    }
  }
  else {
    printf("Property holds.\n");
  }
  Gia_ManHashStop(p_00->pFrames);
  pGVar4 = p_00->pFrames;
  p_00->pFrames = (Gia_Man_t *)0x0;
  Ccf_ManStop(p_00);
  pGVar6 = Gia_ManCleanup(pGVar4);
  Gia_ManStop(pGVar4);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManCofTest( Gia_Man_t * pGia, int nFrameMax, int nConfMax, int nTimeMax, int fVerbose )
{ 
    Gia_Man_t * pNew;
    Ccf_Man_t * p;
    Gia_Obj_t * pObj;
    int f, i, Lit, RetValue = -1, fFailed = 0;
    abctime nTimeToStop = Abc_Clock() + nTimeMax * CLOCKS_PER_SEC;
    abctime clk = Abc_Clock();
    assert( Gia_ManPoNum(pGia) == 1 );

    // create reachability manager
    p = Ccf_ManStart( pGia, nFrameMax, nConfMax, nTimeMax, fVerbose );

    // set runtime limit
    if ( nTimeMax )
        sat_solver_set_runtime_limit( p->pSat, nTimeToStop );

    // perform backward image computation
    for ( f = 0; f < nFrameMax; f++ )
    {
        if ( fVerbose ) 
            printf( "ITER %3d :\n", f );
        // add to the mapping of nodes
        p->pFrames = (Gia_Man_t *)Gia_ManUnrollAdd( p->pUnr, f+1 );
        // add SAT clauses
        Gia_ManCofExtendSolver( p );
        // return output literal
        Lit = Gia_ManUnrollLastLit( p->pUnr );
        // derives cofactors of the property literal till all states are blocked
        RetValue = Gia_ManCofGetReachable( p, Lit );
        if ( RetValue )
            break;

        // check the property output
        Gia_ManSetPhase( p->pFrames );
        Gia_ManForEachPo( p->pFrames, pObj, i )
            if ( pObj->fPhase )
            {
                printf( "Property failed in frame %d.\n", f );
                fFailed = 1;
                break;
            }
        if ( i < Gia_ManPoNum(p->pFrames) )
            break;
    }

    // report the result
    if ( nTimeToStop && Abc_Clock() > nTimeToStop )
        printf( "Runtime limit (%d sec) is reached after %d frames.  ", nTimeMax, f );
    else if ( f == nFrameMax )
        printf( "Completed %d frames without converging.  ", f );
    else if ( RetValue == 1 )
        printf( "Backward reachability converged after %d iterations.  ", f-1 );
    else if ( RetValue == -1 )
        printf( "Conflict limit or timeout is reached after %d frames.  ", f-1 );
    Abc_PrintTime( 1, "Runtime", Abc_Clock() - clk );

    if ( !fFailed && RetValue == 1 )
        printf( "Property holds.\n" );
    else if ( !fFailed )
        printf( "Property is undecided.\n" );

    // get the resulting AIG manager
    Gia_ManHashStop( p->pFrames );
    pNew = p->pFrames;  p->pFrames = NULL;
    Ccf_ManStop( p );

    // cleanup
//    if ( fVerbose )
//        Gia_ManPrintStats( pNew, 0 );
    pNew = Gia_ManCleanup( pGia = pNew );
    Gia_ManStop( pGia );
//    if ( fVerbose )
//        Gia_ManPrintStats( pNew, 0 );
    return pNew;   
}